

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O3

WW<127UL> * __thiscall GF2::WW<127UL>::Permute(WW<127UL> *this,size_t *pi)

{
  ulong uVar1;
  ulong uVar2;
  size_t pos;
  ulong uVar3;
  WW<127UL> temp;
  WW<127UL> local_28;
  
  WW(&local_28);
  uVar3 = 0;
  do {
    uVar1 = pi[uVar3];
    if (uVar1 == 0xffffffffffffffff) {
      uVar2 = 1L << ((byte)uVar3 & 0x3f);
LAB_001214fb:
      local_28._words[uVar3 >> 6] = local_28._words[uVar3 >> 6] & ~uVar2;
    }
    else {
      uVar2 = 1L << ((byte)uVar3 & 0x3f);
      if ((this->_words[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) goto LAB_001214fb;
      local_28._words[uVar3 >> 6] = local_28._words[uVar3 >> 6] | uVar2;
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x7f) {
      this->_words[0] = local_28._words[0];
      this->_words[1] = local_28._words[1];
      return this;
    }
  } while( true );
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}